

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineStatusOutput.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_d7e82::CommandLineStatusOutputImpl::writeText
          (CommandLineStatusOutputImpl *this,string *text)

{
  uint uVar1;
  
  if (this->fp == (FILE *)0x0) {
    __assert_fail("isOpen()",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Commands/CommandLineStatusOutput.cpp"
                  ,0xce,
                  "void (anonymous namespace)::CommandLineStatusOutputImpl::writeText(std::string &&)"
                 );
  }
  if ((text->_M_string_length != 0) &&
     ((text->_M_dataplus)._M_p[text->_M_string_length - 1] == '\n')) {
    if (this->hasOutput == true) {
      clearOutput(this);
    }
    uVar1._0_1_ = this->stripColor;
    uVar1._1_1_ = this->termHonorsCarriageReturn;
    uVar1._2_1_ = this->hasOutput;
    uVar1._3_1_ = this->isClosed;
    stripColorCodes((CommandLineStatusOutputImpl *)(ulong)uVar1,text);
    fwrite((text->_M_dataplus)._M_p,text->_M_string_length,1,(FILE *)this->fp);
    fflush((FILE *)this->fp);
    return;
  }
  __assert_fail("text.size() && text.back() == \'\\n\'",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Commands/CommandLineStatusOutput.cpp"
                ,0xcf,
                "void (anonymous namespace)::CommandLineStatusOutputImpl::writeText(std::string &&)"
               );
}

Assistant:

bool isOpen() const {
    return fp != nullptr;
  }